

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinKrylovDemo_ls.c
# Opt level: O2

void WebRate(sunrealtype xx,sunrealtype yy,sunrealtype *cxy,sunrealtype *ratesxy,void *user_data)

{
  long lVar1;
  long lVar2;
  long lVar3;
  sunrealtype temp;
  double dVar4;
  
  lVar1 = *(long *)((long)user_data + 400);
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    dVar4 = 0.0;
    for (lVar3 = 0; (int)lVar3 != 6; lVar3 = lVar3 + 1) {
      dVar4 = dVar4 + cxy[lVar3] * *(double *)(*(long *)(lVar1 + lVar2 * 8) + lVar3 * 8);
    }
    ratesxy[lVar2] = dVar4;
  }
  lVar1 = *(long *)((long)user_data + 0x198);
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    ratesxy[lVar2] =
         (*(double *)(lVar1 + lVar2 * 8) * (xx * yy + 1.0) + ratesxy[lVar2]) * cxy[lVar2];
  }
  return;
}

Assistant:

static void WebRate(sunrealtype xx, sunrealtype yy, sunrealtype* cxy,
                    sunrealtype* ratesxy, void* user_data)
{
  int i;
  sunrealtype fac;
  UserData data;

  data = (UserData)user_data;

  for (i = 0; i < NUM_SPECIES; i++)
  {
    ratesxy[i] = DotProd(NUM_SPECIES, cxy, acoef[i]);
  }

  fac = ONE + ALPHA * xx * yy;

  for (i = 0; i < NUM_SPECIES; i++)
  {
    ratesxy[i] = cxy[i] * (bcoef[i] * fac + ratesxy[i]);
  }
}